

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t itime;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  unsigned_long uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  undefined1 auVar54 [16];
  float fVar56;
  undefined1 auVar55 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  ulong local_228;
  size_t local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  anon_class_16_2_07cfa4d6 local_190;
  ulong local_180;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar25 = r->_begin;
  auVar59 = ZEXT464(0x3f800000);
  auVar30._8_4_ = 0x7f800000;
  auVar30._0_8_ = 0x7f8000007f800000;
  auVar30._12_4_ = 0x7f800000;
  auVar68 = ZEXT1664(auVar30);
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  auVar64 = ZEXT1664(auVar29);
  fVar27 = 1.0;
  auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
  local_228 = 0;
  auVar69 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar70 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  fVar28 = 0.0;
  auVar71 = ZEXT1664(auVar29);
  auVar72 = ZEXT1664(auVar30);
  auVar74 = ZEXT1664(auVar29);
  auVar75 = ZEXT1664(auVar30);
  auVar29 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar73 = ZEXT1664(auVar29);
  local_200 = k;
  while( true ) {
    auVar29 = auVar59._0_16_;
    if (r->_end <= uVar25) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar75._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar74._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar72._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar71._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar68._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar64._0_16_;
      BVar2 = (BBox1f)vmovlps_avx(auVar29);
      __return_storage_ptr__->time_range = BVar2;
      auVar29 = vmovdqu64_avx512vl(auVar73._0_16_);
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar29;
      __return_storage_ptr__->max_num_time_segments = local_228;
      (__return_storage_ptr__->max_time_range).lower = fVar28;
      (__return_storage_ptr__->max_time_range).upper = fVar27;
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar31._8_8_ = 0;
    auVar31._0_4_ = BVar2.lower;
    auVar31._4_4_ = BVar2.upper;
    auVar30 = vmovshdup_avx(auVar31);
    fVar32 = BVar2.lower;
    fVar33 = auVar30._0_4_ - fVar32;
    uVar18 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.field_0x68 * uVar25);
    uVar24 = (ulong)(uVar18 + 1);
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    if (uVar24 < (pBVar3->super_RawBufferView).num) break;
LAB_01c2e515:
    uVar25 = uVar25 + 1;
  }
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar30 = vmulss_avx512f(ZEXT416((uint)fVar1),
                           ZEXT416((uint)(((t0t1->upper - fVar32) / fVar33) * 0.99999976)));
  auVar30 = vroundss_avx(auVar30,auVar30,10);
  auVar31 = vminss_avx512f(auVar30,ZEXT416((uint)fVar1));
  fVar45 = (t0t1->lower - fVar32) / fVar33;
  auVar30 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar45 * 1.0000002)));
  auVar30 = vroundss_avx(auVar30,auVar30,9);
  auVar30 = vmaxss_avx(auVar55._0_16_,auVar30);
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  lVar23 = (long)(int)auVar30._0_4_ * 0x38 + 0x10;
  uVar22 = (long)(int)auVar30._0_4_ - 1;
LAB_01c2e0fc:
  uVar22 = uVar22 + 1;
  if ((ulong)(long)(int)auVar31._0_4_ < uVar22) {
    auVar30 = vmovdqa64_avx512vl(auVar73._0_16_);
    local_190.primID = &local_180;
    fVar33 = (t0t1->upper - fVar32) / fVar33;
    fVar32 = fVar1 * fVar45;
    fVar35 = fVar1 * fVar33;
    auVar67 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),9);
    auVar48 = vroundss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),10);
    auVar31 = vmaxss_avx(auVar67,auVar55._0_16_);
    auVar63 = vminss_avx(auVar48,ZEXT416((uint)fVar1));
    iVar20 = (int)auVar31._0_4_;
    fVar44 = auVar63._0_4_;
    iVar19 = (int)auVar67._0_4_;
    iVar21 = -1;
    if (-1 < iVar19) {
      iVar21 = iVar19;
    }
    iVar17 = (int)fVar1 + 1;
    if ((int)auVar48._0_4_ < (int)fVar1 + 1) {
      iVar17 = (int)auVar48._0_4_;
    }
    local_190.this = this;
    local_180 = uVar25;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_190,(long)iVar20);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_190,(long)(int)fVar44);
    fVar32 = fVar32 - auVar31._0_4_;
    if (iVar17 - iVar21 == 1) {
      auVar31 = vmaxss_avx(ZEXT416((uint)fVar32),ZEXT816(0) << 0x40);
      fVar32 = auVar31._0_4_;
      fVar33 = 1.0 - fVar32;
      auVar60._0_4_ = fVar32 * bupper1.lower.field_0._0_4_;
      auVar60._4_4_ = fVar32 * bupper1.lower.field_0._4_4_;
      auVar60._8_4_ = fVar32 * bupper1.lower.field_0._8_4_;
      auVar60._12_4_ = fVar32 * bupper1.lower.field_0._12_4_;
      auVar38._4_4_ = fVar33;
      auVar38._0_4_ = fVar33;
      auVar38._8_4_ = fVar33;
      auVar38._12_4_ = fVar33;
      auVar63 = vfmadd231ps_fma(auVar60,auVar38,(undefined1  [16])blower0.lower.field_0);
      auVar65._0_4_ = fVar32 * bupper1.upper.field_0._0_4_;
      auVar65._4_4_ = fVar32 * bupper1.upper.field_0._4_4_;
      auVar65._8_4_ = fVar32 * bupper1.upper.field_0._8_4_;
      auVar65._12_4_ = fVar32 * bupper1.upper.field_0._12_4_;
      auVar67 = vfmadd231ps_fma(auVar65,(undefined1  [16])blower0.upper.field_0,auVar38);
      auVar31 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar35)),ZEXT816(0) << 0x40);
      fVar32 = auVar31._0_4_;
      fVar33 = 1.0 - fVar32;
      auVar46._0_4_ = fVar32 * blower0.lower.field_0._0_4_;
      auVar46._4_4_ = fVar32 * blower0.lower.field_0._4_4_;
      auVar46._8_4_ = fVar32 * blower0.lower.field_0._8_4_;
      auVar46._12_4_ = fVar32 * blower0.lower.field_0._12_4_;
      auVar39._4_4_ = fVar33;
      auVar39._0_4_ = fVar33;
      auVar39._8_4_ = fVar33;
      auVar39._12_4_ = fVar33;
      auVar48 = vfmadd231ps_fma(auVar46,auVar39,(undefined1  [16])bupper1.lower.field_0);
      auVar50._0_4_ = fVar32 * blower0.upper.field_0._0_4_;
      auVar50._4_4_ = fVar32 * blower0.upper.field_0._4_4_;
      auVar50._8_4_ = fVar32 * blower0.upper.field_0._8_4_;
      auVar50._12_4_ = fVar32 * blower0.upper.field_0._12_4_;
      auVar54 = vfmadd231ps_fma(auVar50,auVar39,(undefined1  [16])bupper1.upper.field_0);
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_190,(long)(iVar20 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_190,(long)((int)fVar44 + -1));
      auVar31 = vmaxss_avx(ZEXT416((uint)fVar32),ZEXT816(0) << 0x40);
      fVar34 = auVar31._0_4_;
      fVar32 = 1.0 - fVar34;
      auVar62._0_4_ = fVar34 * blower1.lower.field_0.m128[0];
      auVar62._4_4_ = fVar34 * blower1.lower.field_0.m128[1];
      auVar62._8_4_ = fVar34 * blower1.lower.field_0.m128[2];
      auVar62._12_4_ = fVar34 * blower1.lower.field_0.m128[3];
      auVar40._4_4_ = fVar32;
      auVar40._0_4_ = fVar32;
      auVar40._8_4_ = fVar32;
      auVar40._12_4_ = fVar32;
      auVar63 = vfmadd231ps_fma(auVar62,auVar40,(undefined1  [16])blower0.lower.field_0);
      auVar66._0_4_ = fVar34 * blower1.upper.field_0.m128[0];
      auVar66._4_4_ = fVar34 * blower1.upper.field_0.m128[1];
      auVar66._8_4_ = fVar34 * blower1.upper.field_0.m128[2];
      auVar66._12_4_ = fVar34 * blower1.upper.field_0.m128[3];
      auVar67 = vfmadd231ps_fma(auVar66,auVar40,(undefined1  [16])blower0.upper.field_0);
      auVar31 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar35)),ZEXT816(0) << 0x40);
      fVar35 = auVar31._0_4_;
      fVar32 = 1.0 - fVar35;
      auVar47._0_4_ = fVar35 * bupper0.lower.field_0.m128[0];
      auVar47._4_4_ = fVar35 * bupper0.lower.field_0.m128[1];
      auVar47._8_4_ = fVar35 * bupper0.lower.field_0.m128[2];
      auVar47._12_4_ = fVar35 * bupper0.lower.field_0.m128[3];
      auVar41._4_4_ = fVar32;
      auVar41._0_4_ = fVar32;
      auVar41._8_4_ = fVar32;
      auVar41._12_4_ = fVar32;
      auVar48 = vfmadd231ps_fma(auVar47,auVar41,(undefined1  [16])bupper1.lower.field_0);
      auVar53._0_4_ = fVar35 * bupper0.upper.field_0.m128[0];
      auVar53._4_4_ = fVar35 * bupper0.upper.field_0.m128[1];
      auVar53._8_4_ = fVar35 * bupper0.upper.field_0.m128[2];
      auVar53._12_4_ = fVar35 * bupper0.upper.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar53,auVar41,(undefined1  [16])bupper1.upper.field_0);
      if (iVar19 < 0) {
        iVar19 = -1;
      }
      itime = (size_t)iVar19;
      while (itime = itime + 1, (long)itime < (long)iVar17) {
        fVar35 = ((float)(int)itime / fVar1 - fVar45) / (fVar33 - fVar45);
        fVar32 = 1.0 - fVar35;
        auVar43._0_4_ = auVar48._0_4_ * fVar35;
        fVar44 = auVar48._4_4_;
        auVar43._4_4_ = fVar44 * fVar35;
        fVar34 = auVar48._8_4_;
        auVar43._8_4_ = fVar34 * fVar35;
        fVar49 = auVar48._12_4_;
        auVar43._12_4_ = fVar49 * fVar35;
        auVar42._4_4_ = fVar32;
        auVar42._0_4_ = fVar32;
        auVar42._8_4_ = fVar32;
        auVar42._12_4_ = fVar32;
        auVar31 = vfmadd231ps_fma(auVar43,auVar42,auVar63);
        auVar37._0_4_ = auVar54._0_4_ * fVar35;
        fVar32 = auVar54._4_4_;
        auVar37._4_4_ = fVar32 * fVar35;
        fVar56 = auVar54._8_4_;
        auVar37._8_4_ = fVar56 * fVar35;
        fVar57 = auVar54._12_4_;
        auVar37._12_4_ = fVar57 * fVar35;
        auVar40 = vfmadd231ps_fma(auVar37,auVar67,auVar42);
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_190,itime);
        local_1f8 = auVar67._0_4_;
        fStack_1f4 = auVar67._4_4_;
        fStack_1f0 = auVar67._8_4_;
        fStack_1ec = auVar67._12_4_;
        local_1e8 = auVar63._0_4_;
        fStack_1e4 = auVar63._4_4_;
        fStack_1e0 = auVar63._8_4_;
        fStack_1dc = auVar63._12_4_;
        auVar31 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar31);
        auVar63 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar40);
        auVar67 = vminps_avx(auVar31,ZEXT816(0) << 0x40);
        auVar31 = vmaxps_avx(auVar63,ZEXT816(0) << 0x40);
        auVar63._0_4_ = local_1e8 + auVar67._0_4_;
        auVar63._4_4_ = fStack_1e4 + auVar67._4_4_;
        auVar63._8_4_ = fStack_1e0 + auVar67._8_4_;
        auVar63._12_4_ = fStack_1dc + auVar67._12_4_;
        auVar48._0_4_ = auVar48._0_4_ + auVar67._0_4_;
        auVar48._4_4_ = fVar44 + auVar67._4_4_;
        auVar48._8_4_ = fVar34 + auVar67._8_4_;
        auVar48._12_4_ = fVar49 + auVar67._12_4_;
        auVar67._0_4_ = local_1f8 + auVar31._0_4_;
        auVar67._4_4_ = fStack_1f4 + auVar31._4_4_;
        auVar67._8_4_ = fStack_1f0 + auVar31._8_4_;
        auVar67._12_4_ = fStack_1ec + auVar31._12_4_;
        auVar54._0_4_ = auVar54._0_4_ + auVar31._0_4_;
        auVar54._4_4_ = fVar32 + auVar31._4_4_;
        auVar54._8_4_ = fVar56 + auVar31._8_4_;
        auVar54._12_4_ = fVar57 + auVar31._12_4_;
      }
    }
    aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar63,ZEXT416(geomID),0x30);
    uVar18 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar22 = (ulong)uVar18;
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar36._8_8_ = 0;
    auVar36._0_4_ = BVar2.lower;
    auVar36._4_4_ = BVar2.upper;
    aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx(auVar67,ZEXT416((uint)uVar25),0x30);
    aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar48,ZEXT416(uVar18),0x30);
    aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar54,ZEXT416(uVar18),0x30);
    auVar61._8_4_ = 0x3f000000;
    auVar61._0_8_ = 0x3f0000003f000000;
    auVar61._12_4_ = 0x3f000000;
    auVar51._0_4_ = aVar13.x * 0.5;
    auVar51._4_4_ = aVar13.y * 0.5;
    auVar51._8_4_ = aVar13.z * 0.5;
    auVar51._12_4_ = aVar13.field_3.w * 0.5;
    auVar31 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar11,auVar61);
    auVar58._0_4_ = aVar14.x * 0.5;
    auVar58._4_4_ = aVar14.y * 0.5;
    auVar58._8_4_ = aVar14.z * 0.5;
    auVar58._12_4_ = aVar14.field_3.w * 0.5;
    auVar63 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar12,auVar61);
    auVar52._0_4_ = auVar31._0_4_ + auVar63._0_4_;
    auVar52._4_4_ = auVar31._4_4_ + auVar63._4_4_;
    auVar52._8_4_ = auVar31._8_4_ + auVar63._8_4_;
    auVar52._12_4_ = auVar31._12_4_ + auVar63._12_4_;
    auVar31 = vminps_avx512vl((undefined1  [16])auVar75._0_16_,(undefined1  [16])aVar11);
    auVar75 = ZEXT1664(auVar31);
    auVar31 = vmaxps_avx512vl((undefined1  [16])auVar74._0_16_,(undefined1  [16])aVar12);
    auVar74 = ZEXT1664(auVar31);
    auVar31 = vminps_avx512vl((undefined1  [16])auVar72._0_16_,(undefined1  [16])aVar13);
    auVar72 = ZEXT1664(auVar31);
    auVar31 = vmaxps_avx((undefined1  [16])auVar71._0_16_,(undefined1  [16])aVar14);
    auVar71 = ZEXT1664(auVar31);
    auVar31 = vminps_avx((undefined1  [16])auVar68._0_16_,auVar52);
    auVar68 = ZEXT1664(auVar31);
    auVar31 = vmaxps_avx((undefined1  [16])auVar64._0_16_,auVar52);
    auVar64 = ZEXT1664(auVar31);
    uVar24 = vcmpps_avx512vl(auVar29,auVar36,1);
    auVar31 = vinsertps_avx(auVar29,auVar36,0x50);
    auVar29 = vblendps_avx(auVar36,auVar29,2);
    bVar26 = (bool)((byte)uVar24 & 1);
    bVar8 = (bool)((byte)(uVar24 >> 1) & 1);
    bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
    bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar59 = ZEXT1664(CONCAT412((uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * auVar29._12_4_,
                                 CONCAT48((uint)bVar9 * auVar31._8_4_ | (uint)!bVar9 * auVar29._8_4_
                                          ,CONCAT44((uint)bVar8 * auVar31._4_4_ |
                                                    (uint)!bVar8 * auVar29._4_4_,
                                                    (uint)bVar26 * auVar31._0_4_ |
                                                    (uint)!bVar26 * auVar29._0_4_))));
    auVar29 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar29 = vpinsrq_avx(auVar29,uVar22,1);
    auVar30 = vmovdqa64_avx512vl(auVar30);
    auVar29 = vpaddq_avx512vl(auVar30,auVar29);
    auVar73 = ZEXT1664(auVar29);
    bVar26 = local_228 < uVar22;
    auVar29 = vmovshdup_avx(auVar36);
    fVar27 = (float)((uint)bVar26 * auVar29._0_4_ + (uint)!bVar26 * (int)fVar27);
    fVar28 = (float)((uint)bVar26 * (int)BVar2.lower + (uint)!bVar26 * (int)fVar28);
    if (local_228 <= uVar22) {
      local_228 = uVar22;
    }
    pPVar7 = prims->items;
    pPVar7[local_200].lbounds.bounds0.lower.field_0 = aVar11;
    pPVar7[local_200].lbounds.bounds0.upper.field_0 = aVar12;
    pPVar7[local_200].lbounds.bounds1.lower.field_0.field_1 = aVar13;
    pPVar7[local_200].lbounds.bounds1.upper.field_0.field_1 = aVar14;
    pPVar7[local_200].time_range = BVar2;
    auVar55 = ZEXT864(0) << 0x20;
    auVar69 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar70 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_200 = local_200 + 1;
  }
  else {
    lVar5 = *(long *)((long)pBVar3 + lVar23 + -0x10);
    lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar23);
    auVar30 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar18);
    auVar63 = auVar69._0_16_;
    uVar15 = vcmpps_avx512vl(auVar30,auVar63,6);
    auVar67 = auVar70._0_16_;
    uVar16 = vcmpps_avx512vl(auVar30,auVar67,1);
    if ((byte)((byte)uVar15 & (byte)uVar16) == 0xf) {
      auVar30 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar24);
      uVar15 = vcmpps_avx512vl(auVar30,auVar63,6);
      uVar16 = vcmpps_avx512vl(auVar30,auVar67,1);
      if ((byte)((byte)uVar15 & (byte)uVar16) == 0xf) {
        lVar5 = *(long *)((long)pBVar4 + lVar23 + -0x10);
        lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar23);
        auVar30 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar18);
        uVar15 = vcmpps_avx512vl(auVar30,auVar63,6);
        uVar16 = vcmpps_avx512vl(auVar30,auVar67,1);
        if ((byte)((byte)uVar15 & (byte)uVar16) == 0xf) goto code_r0x01c2e190;
      }
    }
  }
  goto LAB_01c2e515;
code_r0x01c2e190:
  lVar23 = lVar23 + 0x38;
  auVar30 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar24);
  uVar15 = vcmpps_avx512vl(auVar30,auVar63,6);
  uVar16 = vcmpps_avx512vl(auVar30,auVar67,1);
  if ((byte)((byte)uVar15 & (byte)uVar16) != 0xf) goto LAB_01c2e515;
  goto LAB_01c2e0fc;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }